

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O1

shared_handle __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::try_lock_shared
          (cow_guarded<int,_std::timed_mutex> *this)

{
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  undefined8 *puVar2;
  ulong uVar3;
  shared_handle sVar4;
  
  (this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar3 = (ulong)((byte)~*(byte *)(in_RSI + 0x21) & 1);
  LOCK();
  piVar1 = (int *)(in_RSI + 0x24 + uVar3 * 4);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  puVar2 = (undefined8 *)(in_RSI + (ulong)(((byte)~*(byte *)(in_RSI + 0x20) & 1) << 4));
  (this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*puVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_data).m_left.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
  LOCK();
  piVar1 = (int *)(in_RSI + 0x24 + uVar3 * 4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_handle)sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto cow_guarded<T, M>::try_lock_shared() const -> shared_handle
{
    shared_handle retval;

    auto slock = m_data.try_lock_shared();
    if (slock) {
        retval = *slock;
    }

    return retval;
}